

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

PropertyString * __thiscall
Js::ScriptContext::AddPropertyString2(ScriptContext *this,PropertyRecord *propString)

{
  JavascriptLibrary *this_00;
  uint i;
  uint uVar1;
  PropertyString *pPVar2;
  
  i = PropertyStringMap::PStrMapIndex
                (*(char16 *)
                  &propString[1].super_FinalizableObject.super_IRecyclerVisitedObject.
                   _vptr_IRecyclerVisitedObject);
  if ((((this->super_ScriptContextBase).javascriptLibrary)->cache).propertyStrings[i].ptr ==
      (PropertyStringMap *)0x0) {
    InitPropertyStringMap(this,i);
  }
  uVar1 = PropertyStringMap::PStrMapIndex
                    (*(char16 *)
                      ((long)&propString[1].super_FinalizableObject.super_IRecyclerVisitedObject.
                              _vptr_IRecyclerVisitedObject + 2));
  this_00 = (this->super_ScriptContextBase).javascriptLibrary;
  pPVar2 = ((this_00->cache).propertyStrings[i].ptr)->strLen2[uVar1].ptr;
  if (pPVar2 == (PropertyString *)0x0) {
    if ((this->super_ScriptContextBase).isClosed == false) {
      pPVar2 = JavascriptLibrary::CreatePropertyString(this_00,propString);
      Memory::WriteBarrierPtr<Js::PropertyString>::WriteBarrierSet
                (((((this->super_ScriptContextBase).javascriptLibrary)->cache).propertyStrings[i].
                 ptr)->strLen2 + uVar1,pPVar2);
      TrackPid(this,propString);
      pPVar2 = ((((this->super_ScriptContextBase).javascriptLibrary)->cache).propertyStrings[i].ptr)
               ->strLen2[uVar1].ptr;
    }
    else {
      pPVar2 = (PropertyString *)0x0;
    }
  }
  return pPVar2;
}

Assistant:

PropertyString* ScriptContext::AddPropertyString2(const Js::PropertyRecord* propString)
    {
        const char16* buf = propString->GetBuffer();
        const uint i = PropertyStringMap::PStrMapIndex(buf[0]);
        if (this->Cache()->propertyStrings[i] == NULL)
        {
            InitPropertyStringMap(i);
        }
        const uint j = PropertyStringMap::PStrMapIndex(buf[1]);
        if (this->Cache()->propertyStrings[i]->strLen2[j] == NULL && !isClosed)
        {
            this->Cache()->propertyStrings[i]->strLen2[j] = GetLibrary()->CreatePropertyString(propString);
            this->TrackPid(propString);
        }
        return this->Cache()->propertyStrings[i]->strLen2[j];
    }